

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Unicode.cpp
# Opt level: O0

utf32_t axl::enc::toUpperCase(utf32_t c)

{
  ushort uVar1;
  undefined2 *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  uint16_t excWord;
  uint16_t *pe;
  uint16_t props;
  UCaseProps *csp;
  utf32_t c_local;
  
  uVar3 = c >> 5;
  if ((uint)c < 0xd800) {
    local_34 = (uint)ucase_props_trieIndex[(int)uVar3] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar4 = 0;
      if (c < 0xdc00) {
        iVar4 = 0x140;
      }
      local_38 = (uint)ucase_props_trieIndex[(int)(iVar4 + uVar3)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_40 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar3 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_40 = 0x2b20;
        }
        local_3c = local_40;
      }
      else {
        local_3c = 0xcd8;
      }
      local_38 = local_3c;
    }
    local_34 = local_38;
  }
  uVar1 = ucase_props_trieIndex[local_34];
  c_local = c;
  if ((uVar1 & 0x10) == 0) {
    if ((uVar1 & 3) == 1) {
      c_local = ((int)(short)uVar1 >> 7) + c;
    }
  }
  else {
    lVar5 = (long)((int)(uint)uVar1 >> 5) * 2 + 0x1d2752;
    uVar1 = ucase_props_exceptions[(int)(uint)uVar1 >> 5];
    if ((uVar1 & 4) != 0) {
      if ((uVar1 & 0x100) == 0) {
        c_local = (utf32_t)*(ushort *)
                            (lVar5 + (long)(int)(uint)(byte)flagsOffset[(int)(uVar1 & 3)] * 2);
      }
      else {
        puVar2 = (undefined2 *)
                 (lVar5 + (long)(int)((uint)(byte)flagsOffset[(int)(uVar1 & 3)] << 1) * 2);
        c_local = CONCAT22(*puVar2,puVar2[1]);
      }
    }
  }
  return c_local;
}

Assistant:

utf32_t
toUpperCase(utf32_t c) {
	const UCaseProps *csp = GET_CASE_PROPS();
	uint16_t props=UTRIE2_GET16(&csp->trie, c);
	if(!PROPS_HAS_EXCEPTION(props)) {
		if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
			c+=UCASE_GET_DELTA(props);
		}
	} else {
		const uint16_t *pe=GET_EXCEPTIONS(csp, props);
		uint16_t excWord=*pe++;
		if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
			GET_SLOT_VALUE(excWord, UCASE_EXC_UPPER, pe, c);
		}
	}
	return c;
}